

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfIDManifest.cpp
# Opt level: O0

uint64_t __thiscall
Imf_3_4::IDManifest::ChannelGroupManifest::insert
          (ChannelGroupManifest *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *text)

{
  __type _Var1;
  uint uVar2;
  ArgExc *this_00;
  stringstream _iex_throw_s;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000048;
  uint64_t in_stack_00000050;
  ChannelGroupManifest *in_stack_00000058;
  uint64_t hash;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe60;
  ostream local_190 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffe78;
  ulong local_18;
  
  _Var1 = std::operator==(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  if (_Var1) {
    uVar2 = MurmurHash32(in_stack_fffffffffffffe78);
    local_18 = (ulong)uVar2;
  }
  else {
    _Var1 = std::operator==(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
    if (!_Var1) {
      iex_debugTrap();
      std::__cxx11::stringstream::stringstream((stringstream *)&stack0xfffffffffffffe60);
      std::operator<<(local_190,"Cannot compute hash: unknown hashing scheme");
      this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_3_4::ArgExc::ArgExc(this_00,(stringstream *)&stack0xfffffffffffffe60);
      __cxa_throw(this_00,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
    }
    local_18 = MurmurHash64(in_stack_fffffffffffffe78);
  }
  insert(in_stack_00000058,in_stack_00000050,in_stack_00000048);
  return local_18;
}

Assistant:

uint64_t
IDManifest::ChannelGroupManifest::insert (const std::vector<std::string>& text)
{
    uint64_t hash;
    if (_hashScheme == MURMURHASH3_32) { hash = MurmurHash32 (text); }
    else if (_hashScheme == MURMURHASH3_64) { hash = MurmurHash64 (text); }
    else
    {
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Cannot compute hash: unknown hashing scheme");
    }
    insert (hash, text);
    return hash;
}